

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatCxxExceptionMessage_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *description,char *location)

{
  Message *pMVar1;
  internal *local_38;
  char *description_local;
  char *location_local;
  
  local_38 = this;
  description_local = description;
  Message::Message((Message *)&location_local);
  if (this == (internal *)0x0) {
    std::operator<<((ostream *)(location_local + 0x10),"Unknown C++ exception");
  }
  else {
    std::operator<<((ostream *)(location_local + 0x10),"C++ exception with description \"");
    pMVar1 = Message::operator<<((Message *)&location_local,(char **)&local_38);
    Message::operator<<(pMVar1,(char (*) [2])0x22041d);
  }
  std::operator<<((ostream *)(location_local + 0x10)," thrown in ");
  pMVar1 = Message::operator<<((Message *)&location_local,&description_local);
  Message::operator<<(pMVar1,(char (*) [2])0x21809f);
  StringStreamToString(__return_storage_ptr__,(stringstream *)location_local);
  if (location_local != (char *)0x0) {
    (**(code **)(*(long *)location_local + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FormatCxxExceptionMessage(const char* description,
                                             const char* location) {
  Message message;
  if (description != nullptr) {
    message << "C++ exception with description \"" << description << "\"";
  } else {
    message << "Unknown C++ exception";
  }
  message << " thrown in " << location << ".";

  return message.GetString();
}